

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.cpp
# Opt level: O1

ostream * libDAI::operator<<(ostream *os,DEdgeVec *rt)

{
  ostream *poVar1;
  pointer pDVar2;
  long lVar3;
  ulong uVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  pDVar2 = (rt->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((rt->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
      super__Vector_impl_data._M_finish != pDVar2) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      poVar1 = operator<<(os,(DEdge *)((long)&pDVar2->n1 + lVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      uVar4 = uVar4 + 1;
      pDVar2 = (rt->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(rt->
                                   super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 4))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream & operator << (std::ostream & os, const DEdgeVec & rt) {
        os << "[";
        for( size_t n = 0; n < rt.size(); n++ )
            os << rt[n] << ", ";
        os << "]";
        return os;
    }